

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_dense.hpp
# Opt level: O0

type * Disa::operator+(type *__return_storage_ptr__,Matrix_Dense<double,_0UL,_0UL> *matrix_0,
                      Matrix_Dense<double,_2UL,_3UL> *matrix_1)

{
  bool bVar1;
  ostream *poVar2;
  size_t sVar3;
  size_t column;
  source_location *in_RCX;
  anon_class_16_2_f0a71eda local_220;
  function<double_(unsigned_long,_unsigned_long)> local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined **local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  pair<unsigned_long,_unsigned_long> local_38;
  pair<unsigned_long,_unsigned_long> local_28;
  Matrix_Dense<double,_2UL,_3UL> *local_18;
  Matrix_Dense<double,_2UL,_3UL> *matrix_1_local;
  Matrix_Dense<double,_0UL,_0UL> *matrix_0_local;
  
  local_18 = matrix_1;
  matrix_1_local = (Matrix_Dense<double,_2UL,_3UL> *)matrix_0;
  local_28 = Matrix_Dense<double,_0UL,_0UL>::size(matrix_0);
  local_38 = Matrix_Dense<double,_2UL,_3UL>::size(local_18);
  bVar1 = std::operator==(&local_28,&local_38);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_220.matrix_0 = (Matrix_Dense<double,_0UL,_0UL> *)matrix_1_local;
    local_220.matrix_1 = local_18;
    std::function<double(unsigned_long,unsigned_long)>::operator+
              ((function<double(unsigned_long,unsigned_long)> *)&local_210,&local_220);
    sVar3 = Matrix_Dense<double,_0UL,_0UL>::size_row
                      ((Matrix_Dense<double,_0UL,_0UL> *)matrix_1_local);
    column = Matrix_Dense<double,_0UL,_0UL>::size_column
                       ((Matrix_Dense<double,_0UL,_0UL> *)matrix_1_local);
    Matrix_Dense<double,_2UL,_3UL>::Matrix_Dense(__return_storage_ptr__,&local_210,sVar3,column);
    std::function<double_(unsigned_long,_unsigned_long)>::~function(&local_210);
    return __return_storage_ptr__;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
  local_60 = &PTR_s__workspace_llm4binary_github_lic_001ee1e8;
  console_format_abi_cxx11_(&local_58,(Disa *)0x0,(Log_Level)&local_60,in_RCX);
  poVar2 = std::operator<<(poVar2,(string *)&local_58);
  sVar3 = Matrix_Dense<double,_0UL,_0UL>::size_row((Matrix_Dense<double,_0UL,_0UL> *)matrix_1_local)
  ;
  std::__cxx11::to_string(&local_190,sVar3);
  std::operator+(&local_170,"Incompatible matrix dimensions, ",&local_190);
  std::operator+(&local_150,&local_170,",");
  sVar3 = Matrix_Dense<double,_0UL,_0UL>::size_column
                    ((Matrix_Dense<double,_0UL,_0UL> *)matrix_1_local);
  std::__cxx11::to_string(&local_1b0,sVar3);
  std::operator+(&local_130,&local_150,&local_1b0);
  std::operator+(&local_110,&local_130," vs. ");
  sVar3 = Matrix_Dense<double,_2UL,_3UL>::size_row(local_18);
  std::__cxx11::to_string(&local_1d0,sVar3);
  std::operator+(&local_f0,&local_110,&local_1d0);
  std::operator+(&local_d0,&local_f0,",");
  sVar3 = Matrix_Dense<double,_2UL,_3UL>::size_column(local_18);
  std::__cxx11::to_string(&local_1f0,sVar3);
  std::operator+(&local_b0,&local_d0,&local_1f0);
  std::operator+(&local_90,&local_b0,".");
  poVar2 = std::operator<<(poVar2,(string *)&local_90);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_58);
  exit(1);
}

Assistant:

typename Static_Promoter<Matrix_Dense<_type, _row_0, _col_0>, Matrix_Dense<_type, _row_1, _col_1>>::type constexpr
operator+(const Matrix_Dense<_type, _row_0, _col_0>& matrix_0, const Matrix_Dense<_type, _row_1, _col_1>& matrix_1) {
  ASSERT_DEBUG(matrix_0.size() == matrix_1.size(),
               "Incompatible matrix dimensions, " + std::to_string(matrix_0.size_row()) + "," +
               std::to_string(matrix_0.size_column()) + " vs. " + std::to_string(matrix_1.size_row()) + "," +
               std::to_string(matrix_1.size_column()) + ".");
  typedef typename Static_Promoter<Matrix_Dense<_type, _row_0, _col_0>, Matrix_Dense<_type, _row_1, _col_1>>::type
  _return_matrix;
  return _return_matrix(
  [&](std::size_t i_row, std::size_t i_column) { return matrix_0[i_row][i_column] + matrix_1[i_row][i_column]; },
  matrix_0.size_row(), matrix_0.size_column());
}